

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

iterator fmt::v7::
         vformat_to<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>,char,fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>
                   (iterator out,basic_string_view<char> format_str,
                   basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                   args,locale_ref loc)

{
  format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  *end;
  _func_void_void_ptr_parse_context_ptr_basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_ptr
  *p_Var1;
  ulong uVar2;
  _func_void_void_ptr_parse_context_ptr_basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_ptr
  *__n;
  size_t sVar3;
  type tVar4;
  format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  *pfVar5;
  format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  *pfVar6;
  void *pvVar7;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_2
  aVar9;
  size_t sVar10;
  buffer<char> *c;
  char *__src;
  format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  *begin;
  float value;
  ptrdiff_t _Num;
  ulong __n_00;
  undefined1 in_stack_00000008 [16];
  format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  h;
  undefined1 local_88 [32];
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_68;
  char *local_60;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_2
  local_58;
  locale_ref local_50;
  parse_context local_48;
  
  local_88._16_8_ = args.field_1;
  local_88._8_8_ = args.desc_;
  aVar9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_2
           )format_str.size_;
  begin = (format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
           *)format_str.data_;
  if ((aVar9.values_ ==
       (value<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
        *)0x2) && (*(short *)begin == 0x7d7b)) {
    if ((long)local_88._8_8_ < 0) {
      if (((int)(type)args.desc_ < 1) ||
         (tVar4 = ((format_arg *)local_88._16_8_)->type_, tVar4 == none_type)) goto LAB_001102ba;
    }
    else {
      tVar4 = (type)args.desc_ & custom_type;
      if (((undefined1  [16])args & (undefined1  [16])0xf) == (undefined1  [16])0x0) {
LAB_001102ba:
        detail::error_handler::on_error((error_handler *)out.container,"argument not found");
      }
    }
    bVar8.container =
         *(buffer<char> **)
          &((value<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
             *)local_88._16_8_)->field_0;
    __n = (((value<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
             *)local_88._16_8_)->field_0).custom.format;
    value = SUB84(bVar8.container,0);
    local_88._0_8_ = out.container;
    switch(tVar4) {
    case int_type:
      bVar8 = detail::write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_int,_0>
                        (out.container,(int)value);
      return (iterator)bVar8.container;
    case uint_type:
      bVar8 = detail::
              write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_unsigned_int,_0>
                        (out.container,(uint)value);
      return (iterator)bVar8.container;
    case long_long_type:
      bVar8 = detail::
              write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_long_long,_0>
                        (out.container,bVar8.container);
      return (iterator)bVar8.container;
    case ulong_long_type:
      bVar8 = detail::
              write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_unsigned_long_long,_0>
                        (out.container,bVar8.container);
      return (iterator)bVar8.container;
    case int128_type:
      bVar8 = detail::
              write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,___int128,_0>
                        (out.container,bVar8,(__int128)in_stack_00000008);
      return (iterator)bVar8.container;
    case uint128_type:
      bVar8 = detail::
              write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_unsigned___int128,_0>
                        (out.container,bVar8,(unsigned___int128)in_stack_00000008);
      return (iterator)bVar8.container;
    case bool_type:
      __n_00 = (ulong)((uint)value & 1) ^ 5;
      sVar3 = (out.container)->size_;
      uVar2 = __n_00 + sVar3;
      if ((out.container)->capacity_ < uVar2) {
        (**(out.container)->_vptr_buffer)(out.container,uVar2);
      }
      __src = "false";
      if (((ulong)bVar8.container & 1) != 0) {
        __src = "true";
      }
      (out.container)->size_ = uVar2;
      memcpy((out.container)->ptr_ + sVar3,__src,__n_00);
      break;
    case char_type:
      sVar3 = (out.container)->size_;
      uVar2 = sVar3 + 1;
      if ((out.container)->capacity_ < uVar2) {
        (**(out.container)->_vptr_buffer)(out.container,uVar2);
      }
      (out.container)->size_ = uVar2;
      (out.container)->ptr_[sVar3] = (char)bVar8.container;
      break;
    case float_type:
      bVar8 = detail::
              write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_float,_0>
                        (out.container,value);
      return (iterator)bVar8.container;
    case double_type:
      bVar8 = detail::
              write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_double,_0>
                        (out.container,bVar8.container);
      return (iterator)bVar8.container;
    case last_numeric_type:
      local_88._0_8_ =
           detail::
           write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_long_double,_0>
                     ((back_insert_iterator<fmt::v7::detail::buffer<char>_>)out.container,
                      (((value<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                         *)local_88._16_8_)->field_0).long_double_value);
      break;
    case cstring_type:
      bVar8 = detail::write<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                        (out.container,bVar8.container);
      return (iterator)bVar8.container;
    case string_type:
      sVar3 = (out.container)->size_;
      p_Var1 = __n + sVar3;
      if ((_func_void_void_ptr_parse_context_ptr_basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_ptr
           *)(out.container)->capacity_ < p_Var1) {
        (**(out.container)->_vptr_buffer)(out.container,p_Var1);
      }
      (out.container)->size_ = (size_t)p_Var1;
      if (__n != (_func_void_void_ptr_parse_context_ptr_basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_ptr
                  *)0x0) {
        memmove((out.container)->ptr_ + sVar3,bVar8.container,(size_t)__n);
      }
      break;
    case pointer_type:
      bVar8 = detail::
              write_ptr<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,unsigned_long>
                        (out.container,bVar8.container,(basic_format_specs<char> *)0x0);
      return (iterator)bVar8.container;
    case custom_type:
      local_48.format_str_.data_ = (char *)0x0;
      local_48.format_str_.size_ = 0;
      local_48.next_arg_id_ = 0;
      local_88._24_8_ = loc.locale_;
      (*__n)(bVar8.container,&local_48,
             (basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>
              *)local_88);
      break;
    default:
      detail::assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/robertoraggi[P]pgen/build_O3/_deps/fmt-src/include/fmt/format.h"
                          ,0x6bf,"");
    }
  }
  else {
    local_88._24_8_ = local_88._24_8_ & 0xffffffff00000000;
    end = (format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
           *)(&begin->field_0x0 + (long)aVar9.values_);
    local_68.container = out.container;
    local_60 = (char *)local_88._8_8_;
    local_58 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_2
                )local_88._16_8_;
    local_50.locale_ = loc.locale_;
    if ((long)aVar9 < 0x20) {
      local_88._8_8_ = begin;
      if (aVar9.values_ !=
          (value<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
           *)0x0) {
        pfVar6 = begin;
        do {
          local_88._16_8_ = aVar9;
          pfVar5 = (format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                    *)&pfVar6->field_0x1;
          if (*(char *)pfVar6 == '}') {
            if ((pfVar5 == end) || (*(char *)pfVar5 != '}')) {
LAB_001102ae:
              detail::error_handler::on_error
                        ((error_handler *)out.container,"unmatched \'}\' in format string");
            }
            out.container = (buffer<char> *)local_88;
            detail::
            format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
            ::on_text((format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                       *)local_88,(char *)begin,(char *)pfVar5);
            pfVar5 = (format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                      *)&pfVar6->field_0x2;
            begin = pfVar5;
          }
          else if (*(char *)pfVar6 == '{') {
            detail::
            format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
            ::on_text((format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                       *)local_88,(char *)begin,(char *)pfVar6);
            pfVar5 = (format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                      *)detail::
                        parse_replacement_field<char,fmt::v7::detail::format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>,char,fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>&>
                                  ((char *)pfVar6,(char *)end,
                                   (format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                                    *)local_88);
            out.container = (buffer<char> *)pfVar6;
            begin = pfVar5;
          }
          pfVar6 = pfVar5;
          aVar9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_2
                   )local_88._16_8_;
        } while (pfVar5 != end);
      }
LAB_0010ff09:
      local_88._16_8_ = aVar9;
      detail::
      format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
      ::on_text((format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                 *)local_88,(char *)begin,(char *)end);
      local_88._0_8_ = local_68.container;
    }
    else {
      local_88._8_8_ = begin;
      do {
        local_88._16_8_ = aVar9;
        pfVar6 = begin;
        if (*(char *)begin != '{') {
          sVar10 = (long)end - (long)&begin->field_0x1;
          if ((long)sVar10 < 0) goto LAB_00110056;
          pfVar6 = (format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                    *)memchr(&begin->field_0x1,0x7b,sVar10);
          if (pfVar6 == (format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                         *)0x0) {
            sVar10 = (long)end - (long)begin;
            if ((long)sVar10 < 0) goto LAB_00110056;
            goto LAB_0011000d;
          }
        }
        if (begin != pfVar6) {
          while( true ) {
            if ((long)pfVar6 - (long)begin < 0) goto LAB_00110056;
            out.container = (buffer<char> *)begin;
            pvVar7 = memchr(begin,0x7d,(long)pfVar6 - (long)begin);
            if (pvVar7 == (void *)0x0) break;
            pfVar5 = (format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                      *)((long)pvVar7 + 1);
            if ((pfVar5 == pfVar6) || (*(char *)pfVar5 != '}')) goto LAB_001102ae;
            detail::
            format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
            ::on_text((format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                       *)local_88,(char *)begin,(char *)pfVar5);
            begin = (format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                     *)((long)pvVar7 + 2);
          }
          detail::
          format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
          ::on_text((format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                     *)local_88,(char *)begin,(char *)pfVar6);
        }
        begin = (format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                 *)detail::
                   parse_replacement_field<char,fmt::v7::detail::format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>,char,fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>&>
                             ((char *)pfVar6,(char *)end,
                              (format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                               *)local_88);
        local_88._0_8_ = local_68.container;
        aVar9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_2
                 )local_88._16_8_;
      } while (begin != end);
    }
  }
  return (iterator)local_88._0_8_;
LAB_0011000d:
  out.container = (buffer<char> *)begin;
  pvVar7 = memchr(begin,0x7d,sVar10);
  aVar9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_2
           )local_88._16_8_;
  if (pvVar7 == (void *)0x0) goto LAB_0010ff09;
  pfVar6 = (format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
            *)((long)pvVar7 + 1);
  if ((pfVar6 == end) || (*(char *)pfVar6 != '}')) goto LAB_001102ae;
  detail::
  format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  ::on_text((format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
             *)local_88,(char *)begin,(char *)pfVar6);
  begin = (format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
           *)((long)pvVar7 + 2);
  sVar10 = (long)end - (long)begin;
  if ((long)sVar10 < 0) {
LAB_00110056:
    detail::assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/robertoraggi[P]pgen/build_O3/_deps/fmt-src/include/fmt/core.h"
                        ,0x13d,"negative value");
  }
  goto LAB_0011000d;
}

Assistant:

typename Context::iterator vformat_to(
    typename ArgFormatter::iterator out, basic_string_view<Char> format_str,
    basic_format_args<Context> args,
    detail::locale_ref loc = detail::locale_ref()) {
  if (format_str.size() == 2 && detail::equal2(format_str.data(), "{}")) {
    auto arg = args.get(0);
    if (!arg) detail::error_handler().on_error("argument not found");
    using iterator = typename ArgFormatter::iterator;
    return visit_format_arg(
        detail::default_arg_formatter<iterator, Char>{out, args, loc}, arg);
  }
  detail::format_handler<ArgFormatter, Char, Context> h(out, format_str, args,
                                                        loc);
  detail::parse_format_string<false>(format_str, h);
  return h.context.out();
}